

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3879a::BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test::TestBody
          (BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test *this)

{
  AssertionResult *pAVar1;
  pointer pbVar2;
  pointer pbVar3;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar4;
  _Alloc_hider __s2;
  size_type __n;
  int iVar5;
  char *__s;
  size_t sVar6;
  BuildValue *pBVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  MockBuildSystemDelegate *EC;
  long lVar9;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var10;
  char *in_R9;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var11;
  char *pcVar12;
  AssertionResult *pAVar13;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var14;
  bool bVar15;
  StringRef namePrefix;
  StringRef Filename;
  StringRef path;
  StringRef mainFilename;
  StringRef Filename_00;
  StringRef path_00;
  StringRef mainFilename_00;
  StringRef name;
  BuildSystem system;
  allocator local_5aa;
  allocator local_5a9;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  AssertionResult gtest_ar_;
  string local_538 [32];
  string local_518 [32];
  pointer local_4f8;
  AssertHelper local_4f0;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_4e8;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_4e0;
  string linkFileList;
  Optional<llbuild::buildsystem::BuildValue> result;
  MockBuildSystemDelegate delegate;
  BuildKey keyToBuild;
  string local_3a0 [32];
  string local_380 [32];
  SmallString<256U> builddb;
  SmallString<256U> manifest;
  TmpDir tempDir;
  
  namePrefix.Length = 8;
  namePrefix.Data = "TestBody";
  llbuild::TmpDir::TmpDir(&tempDir,namePrefix);
  llbuild::TmpDir::str_abi_cxx11_((string *)&builddb,&tempDir);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&manifest.super_SmallVector<char,_256U>,
             (char *)builddb.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
             (char *)(builddb.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                      super_SmallVectorTemplateBase<char,_true>.
                      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._8_8_ +
                     (long)builddb.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX)
            );
  std::__cxx11::string::_M_dispose();
  llvm::Twine::Twine((Twine *)&builddb,"manifest.llbuild");
  llvm::Twine::Twine((Twine *)&delegate,"");
  llvm::Twine::Twine((Twine *)&result,"");
  llvm::Twine::Twine((Twine *)&gtest_ar_,"");
  llvm::sys::path::append
            (&manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,(Twine *)&builddb,
             (Twine *)&delegate,(Twine *)&result,(Twine *)&gtest_ar_);
  delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate._0_4_ = 0;
  local_4f8 = (pointer)std::_V2::system_category();
  EC = &delegate;
  Filename.Length._4_4_ = 0;
  Filename._0_12_ =
       manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase._0_12_;
  delegate.super_BuildSystemDelegate.name._M_dataplus._M_p = local_4f8;
  llvm::raw_fd_ostream::raw_fd_ostream((raw_fd_ostream *)&builddb,Filename,(error_code *)EC,F_Text);
  if ((int)delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate != 0) {
    __assert_fail("!ec",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                  ,0x388,
                  "virtual void (anonymous namespace)::BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test::TestBody()"
                 );
  }
  llvm::raw_ostream::operator<<
            ((raw_ostream *)&builddb,
             "\nclient:\n  name: mock\n\ncommands:\n    C.1:\n      tool: stale-file-removal\n      expectedOutputs: [\"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic-extra-header.h\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-extra-resource.txt\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Modules/module.modulemap\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic, /var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Hea..." /* TRUNCATED STRING LITERAL */
            );
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&builddb);
  name.Length = (size_t)EC;
  name.Data = (char *)0x3;
  llbuild::buildsystem::BuildKey::makeCommand(&keyToBuild,(BuildKey *)"C.1",name);
  llbuild::TmpDir::str_abi_cxx11_((string *)&delegate,&tempDir);
  llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
            (&builddb.super_SmallVector<char,_256U>,
             (char *)CONCAT44(delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate._4_4_,
                              (int)delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate),
             delegate.super_BuildSystemDelegate.name._M_dataplus._M_p +
             (long)CONCAT44(delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate._4_4_,
                            (int)delegate.super_BuildSystemDelegate._vptr_BuildSystemDelegate));
  std::__cxx11::string::_M_dispose();
  llvm::Twine::Twine((Twine *)&delegate,"build.db");
  pcVar12 = "";
  llvm::Twine::Twine((Twine *)&result,"");
  llvm::Twine::Twine((Twine *)&gtest_ar_,"");
  llvm::Twine::Twine((Twine *)&linkFileList,"");
  llvm::sys::path::append
            (&builddb.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,(Twine *)&delegate,
             (Twine *)&result,(Twine *)&gtest_ar_,(Twine *)&linkFileList);
  std::__cxx11::string::string
            ((string *)&linkFileList,
             "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList"
             ,(allocator *)&delegate);
  llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate(&delegate,true);
  llbuild::basic::createLocalFileSystem();
  llbuild::buildsystem::BuildSystem::BuildSystem
            (&system,&delegate.super_BuildSystemDelegate,
             (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)&local_4e0);
  if (local_4e0._M_head_impl != (FileSystem *)0x0) {
    (*(local_4e0._M_head_impl)->_vptr_FileSystem[1])();
  }
  local_4e0._M_head_impl = (FileSystem *)0x0;
  __s = llvm::SmallString<256U>::c_str(&builddb);
  if (__s == (char *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar6 = strlen(__s);
  }
  path.Length = sVar6;
  path.Data = __s;
  llbuild::buildsystem::BuildSystem::attachDB(&system,path,(string *)0x0);
  mainFilename.Length._4_4_ = 0;
  mainFilename._0_12_ =
       manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase._0_12_;
  gtest_ar_.success_ = llbuild::buildsystem::BuildSystem::loadDescription(&system,mainFilename);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&result,(internal *)&gtest_ar_,(AssertionResult *)"loadingResult","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&messages,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
               ,0x3a4,(char *)CONCAT44(result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                       buffer._4_4_,
                                       result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                       buffer._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&messages,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&messages);
    std::__cxx11::string::_M_dispose();
    if (gtest_ar__1._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
    }
LAB_0012b232:
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_0012b31d;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string(local_380,(string *)&keyToBuild);
  llbuild::buildsystem::BuildSystem::build(&result,&system,(BuildKey *)local_380);
  std::__cxx11::string::_M_dispose();
  gtest_ar__1.success_ = result.Storage.hasVal;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (result.Storage.hasVal == false) {
    testing::Message::Message((Message *)&messages);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"result.hasValue()",
               "false","true",in_R9);
    pcVar12 = (char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_);
    iVar5 = 0x3a8;
LAB_0012b2da:
    this_00 = &gtest_ar__1.message_;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
               ,iVar5,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&messages);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    std::__cxx11::string::_M_dispose();
    if (messages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(((messages.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
    }
LAB_0012b30b:
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    pBVar7 = llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer(&result);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    bVar15 = pBVar7->kind == StaleFileRemoval;
    gtest_ar__1.success_ = bVar15;
    if (!bVar15) {
      testing::Message::Message((Message *)&messages);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                 (AssertionResult *)"result.getValue().isStaleFileRemoval()","false","true",in_R9);
      pcVar12 = (char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_);
      iVar5 = 0x3a9;
      goto LAB_0012b2da;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    pBVar7 = llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer(&result);
    llbuild::buildsystem::BuildValue::getStaleFileList
              ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&gtest_ar_,pBVar7);
    messages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl - CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) >> 4);
    gtest_ar_1.success_ = true;
    gtest_ar_1._1_7_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar__1,"result.getValue().getStaleFileList().size()","50UL",
               (unsigned_long *)&messages,(unsigned_long *)&gtest_ar_1);
    std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
              ((_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&gtest_ar_);
    if (gtest_ar__1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar12 = *(char **)gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&messages,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,0x3aa,pcVar12);
      pAVar13 = &gtest_ar_;
      testing::internal::AssertHelper::operator=((AssertHelper *)&messages,(Message *)pAVar13);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&messages);
LAB_0012b3d8:
      pAVar1 = &gtest_ar__1;
      _Var10._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           *(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)pAVar13;
LAB_0012b3db:
      this_00 = &pAVar1->message_;
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )_Var10._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)_Var10._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      goto LAB_0012b30b;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    pBVar7 = llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer(&result);
    llbuild::buildsystem::BuildValue::getStaleFileList
              ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&gtest_ar_,pBVar7);
    __n = linkFileList._M_string_length;
    __s2 = linkFileList._M_dataplus;
    uVar4 = gtest_ar_.message_;
    _Var11._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._1_7_ = gtest_ar_._1_7_;
    _Var11._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = gtest_ar_.success_;
    bVar15 = false;
    for (; _Var11._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl !=
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )uVar4._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        _Var11._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )((long)_Var11._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x10)) {
      if ((*(undefined8 *)
            ((long)_Var11._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl + 8) == __n) &&
         ((__n == 0 ||
          (iVar5 = bcmp(*(void **)_Var11._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl,__s2._M_p,__n), iVar5 == 0)))) {
        bVar15 = true;
      }
    }
    std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
              ((_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&gtest_ar_);
    this_00 = &gtest_ar__1.message_;
    gtest_ar__1.success_ = bVar15;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (bVar15 == false) {
      testing::Message::Message((Message *)&messages);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"hasLinkFileList",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,0x3b3,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&messages);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      std::__cxx11::string::_M_dispose();
      if (messages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(((messages.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
      }
      goto LAB_0012b30b;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    std::__cxx11::string::string
              ((string *)&gtest_ar_,"commandPreparing(C.1)",(allocator *)&local_4f0);
    std::__cxx11::string::string(local_538,"commandStarted(C.1)",&local_5a9);
    std::__cxx11::string::string(local_518,"commandFinished(C.1: 0)",&local_5aa);
    gtest_ar__1.success_ = false;
    gtest_ar__1._1_7_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&gtest_ar__1,
               &gtest_ar_,&local_4f8);
    llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_(&messages,&delegate);
    testing::internal::
    CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((internal *)&gtest_ar_1,
               "std::vector<std::string>({ \"commandPreparing(C.1)\", \"commandStarted(C.1)\", \"commandFinished(C.1: 0)\", })"
               ,"delegate.getMessages()",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&gtest_ar__1,&messages);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&messages);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&gtest_ar__1);
    lVar9 = 0x40;
    do {
      std::__cxx11::string::_M_dispose();
      lVar9 = lVar9 + -0x20;
    } while (lVar9 != -0x20);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = *(char **)gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      pAVar1 = &gtest_ar_1;
      pAVar13 = &gtest_ar__1;
      iVar5 = 0x3b9;
LAB_0012b6b2:
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)pAVar13,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,iVar5,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)pAVar13,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar13);
      _Var10._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._1_7_ = gtest_ar_._1_7_;
      _Var10._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = gtest_ar_.success_;
      goto LAB_0012b3db;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::reset
              (&result.Storage);
    llbuild::buildsystem::BuildSystem::~BuildSystem(&system);
    llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate(&delegate);
    result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[0] = '\0';
    result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[1] = '\0';
    result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[2] = '\0';
    result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer[3] = '\0';
    result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._8_8_ = local_4f8;
    Filename_00.Length._4_4_ = 0;
    Filename_00._0_12_ =
         manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase._0_12_;
    llvm::raw_fd_ostream::raw_fd_ostream
              ((raw_fd_ostream *)&delegate,Filename_00,(error_code *)&result,F_Text);
    if (result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.buffer._0_4_ != 0) {
      __assert_fail("!ec",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                    ,0x3bf,
                    "virtual void (anonymous namespace)::BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test::TestBody()"
                   );
    }
    llvm::raw_ostream::operator<<
              ((raw_ostream *)&delegate,
               "\nclient:\n  name: mock\n\ncommands:\n    C.1:\n      tool: stale-file-removal\n      expectedOutputs: [\"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Headers\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Resources\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/Current\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-non-framework-target-headers.hmap\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-targe..." /* TRUNCATED STRING LITERAL */
              );
    llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&delegate);
    llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate(&delegate,true);
    llbuild::basic::createLocalFileSystem();
    llbuild::buildsystem::BuildSystem::BuildSystem
              (&system,&delegate.super_BuildSystemDelegate,
               (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                *)&local_4e8);
    if (local_4e8._M_head_impl != (FileSystem *)0x0) {
      (*(local_4e8._M_head_impl)->_vptr_FileSystem[1])();
    }
    local_4e8._M_head_impl = (FileSystem *)0x0;
    pcVar12 = llvm::SmallString<256U>::c_str(&builddb);
    if (pcVar12 == (char *)0x0) {
      sVar6 = 0;
    }
    else {
      sVar6 = strlen(pcVar12);
    }
    path_00.Length = sVar6;
    path_00.Data = pcVar12;
    llbuild::buildsystem::BuildSystem::attachDB(&system,path_00,(string *)0x0);
    mainFilename_00.Length._4_4_ = 0;
    mainFilename_00._0_12_ =
         manifest.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
         super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
         super_SmallVectorBase._0_12_;
    gtest_ar_.success_ = llbuild::buildsystem::BuildSystem::loadDescription(&system,mainFilename_00)
    ;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&gtest_ar__1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&result,(internal *)&gtest_ar_,(AssertionResult *)"loadingResult","false"
                 ,"true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&messages,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,0x3d1,(char *)CONCAT44(result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                         buffer._4_4_,
                                         result.Storage.storage.super_AlignedCharArray<8UL,_112UL>.
                                         buffer._0_4_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&messages,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&messages);
      std::__cxx11::string::_M_dispose();
      if (gtest_ar__1._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
      }
      goto LAB_0012b232;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    std::__cxx11::string::string(local_3a0,(string *)&keyToBuild);
    llbuild::buildsystem::BuildSystem::build(&result,&system,(BuildKey *)local_3a0);
    std::__cxx11::string::_M_dispose();
    gtest_ar__1.success_ = result.Storage.hasVal;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (result.Storage.hasVal == false) {
      testing::Message::Message((Message *)&messages);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                 (AssertionResult *)"result.hasValue()","false","true",in_R9);
      pcVar12 = (char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_);
      iVar5 = 0x3d4;
LAB_0012b99c:
      pAVar13 = (AssertionResult *)&messages;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,iVar5,pcVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)pAVar13);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      std::__cxx11::string::_M_dispose();
      goto LAB_0012b3d8;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    pBVar7 = llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer(&result);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    bVar15 = pBVar7->kind == StaleFileRemoval;
    gtest_ar__1.success_ = bVar15;
    if (!bVar15) {
      testing::Message::Message((Message *)&messages);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                 (AssertionResult *)"result.getValue().isStaleFileRemoval()","false","true",in_R9);
      pcVar12 = (char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_);
      iVar5 = 0x3d5;
      goto LAB_0012b99c;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    pBVar7 = llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer(&result);
    llbuild::buildsystem::BuildValue::getStaleFileList
              ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&gtest_ar_,pBVar7);
    messages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)gtest_ar_.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl - CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) >> 4);
    gtest_ar_1.success_ = true;
    gtest_ar_1._1_7_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar__1,"result.getValue().getStaleFileList().size()","22UL",
               (unsigned_long *)&messages,(unsigned_long *)&gtest_ar_1);
    std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
              ((_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&gtest_ar_);
    if (gtest_ar__1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = *(char **)gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      pAVar1 = &gtest_ar__1;
      pAVar13 = (AssertionResult *)&messages;
      iVar5 = 0x3d6;
      goto LAB_0012b6b2;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    pBVar7 = llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer(&result);
    llbuild::buildsystem::BuildValue::getStaleFileList
              ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&gtest_ar_,pBVar7);
    uVar4 = gtest_ar_.message_;
    _Var14._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._1_7_ = gtest_ar_._1_7_;
    _Var14._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = gtest_ar_.success_;
    bVar15 = false;
    for (; _Var14._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl !=
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )uVar4._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        _Var14._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )((long)_Var14._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x10)) {
      if ((*(undefined8 *)
            ((long)_Var14._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl + 8) == linkFileList._M_string_length) &&
         ((linkFileList._M_string_length == 0 ||
          (iVar5 = bcmp(*(void **)_Var14._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl,linkFileList._M_dataplus._M_p,
                        linkFileList._M_string_length), iVar5 == 0)))) {
        bVar15 = true;
      }
    }
    std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
              ((_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&gtest_ar_);
    gtest_ar__1.success_ = bVar15;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (bVar15 == false) {
      testing::Message::Message((Message *)&messages);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"hasLinkFileList",
                 "false","true",in_R9);
      pcVar12 = (char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_);
      iVar5 = 0x3df;
      goto LAB_0012b99c;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_(&messages,&delegate);
    pbVar3 = messages.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = messages.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar__1
                   ,"cannot remove stale file \'",&linkFileList);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar__1
                   ,"\': No such file or directory");
    _Var8 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (pbVar2,pbVar3,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &gtest_ar_);
    gtest_ar_1.success_ =
         _Var8._M_current ==
         messages.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    if (_Var8._M_current !=
        messages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      testing::Message::Message((Message *)&gtest_ar__1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar_1,
                 (AssertionResult *)
                 "std::find(messages.begin(), messages.end(), \"cannot remove stale file \'\" + linkFileList + \"\': No such file or directory\") != messages.end()"
                 ,"true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_4f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,0x3e3,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
      testing::internal::AssertHelper::operator=(&local_4f0,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper(&local_4f0);
      std::__cxx11::string::_M_dispose();
      if (gtest_ar__1._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_1.message_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&messages);
  }
  llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::reset
            (&result.Storage);
LAB_0012b31d:
  llbuild::buildsystem::BuildSystem::~BuildSystem(&system);
  llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate(&delegate);
  std::__cxx11::string::_M_dispose();
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&builddb);
  std::__cxx11::string::_M_dispose();
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&manifest);
  llbuild::TmpDir::~TmpDir(&tempDir);
  return;
}

Assistant:

TEST(BuildSystemTaskTests, staleFileRemovalWithManyFiles) {
  TmpDir tempDir(__func__);

  SmallString<256> manifest{ tempDir.str() };
  sys::path::append(manifest, "manifest.llbuild");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
    C.1:
      tool: stale-file-removal
      expectedOutputs: ["", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic-extra-header.h", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-extra-resource.txt", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Modules/module.modulemap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic, /var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Modules", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/Current", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-non-framework-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-generated-files.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-own-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-project-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/all-product-headers.yaml", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/module.modulemap"]
      roots: ["/tmp/basic.dst", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products"]
)END";
  }

  auto keyToBuild = BuildKey::makeCommand("C.1");

  SmallString<256> builddb{ tempDir.str() };
  sys::path::append(builddb, "build.db");

  // We will check that the same file is present in both file lists, so it should not show up in the difference.
  std::string linkFileList = "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList";

  {
    MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
    BuildSystem system(delegate, createLocalFileSystem());
    system.attachDB(builddb.c_str(), nullptr);

    bool loadingResult = system.loadDescription(manifest);
    ASSERT_TRUE(loadingResult);

    auto result = system.build(keyToBuild);

    ASSERT_TRUE(result.hasValue());
    ASSERT_TRUE(result.getValue().isStaleFileRemoval());
    ASSERT_EQ(result.getValue().getStaleFileList().size(), 50UL);

    // Check that `LinkFileList` is present in list of files of initial build
    bool hasLinkFileList = false;
    for (auto staleFile : result.getValue().getStaleFileList()) {
      if (staleFile == linkFileList) {
        hasLinkFileList = true;
      }
    }
    ASSERT_TRUE(hasLinkFileList);

    ASSERT_EQ(std::vector<std::string>({
      "commandPreparing(C.1)",
      "commandStarted(C.1)",
      "commandFinished(C.1: 0)",
    }), delegate.getMessages());
  }

  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
    C.1:
      tool: stale-file-removal
      expectedOutputs: ["/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/Current", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-non-framework-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-generated-files.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-own-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-project-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/all-product-headers.yaml"]
      roots: ["/tmp/basic.dst", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products"]
)END";
  }

  MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
  BuildSystem system(delegate, createLocalFileSystem());
  system.attachDB(builddb.c_str(), nullptr);
  bool loadingResult = system.loadDescription(manifest);
  ASSERT_TRUE(loadingResult);
  auto result = system.build(keyToBuild);

  ASSERT_TRUE(result.hasValue());
  ASSERT_TRUE(result.getValue().isStaleFileRemoval());
  ASSERT_EQ(result.getValue().getStaleFileList().size(), 22UL);

  // Check that `LinkFileList` is present in list of files of second build
  bool hasLinkFileList = false;
  for (auto staleFile : result.getValue().getStaleFileList()) {
    if (staleFile == linkFileList) {
      hasLinkFileList = true;
    }
  }
  ASSERT_TRUE(hasLinkFileList);

  // Check that `LinkFileList` is not present in the diff
  std::vector<std::string> messages = delegate.getMessages();
  ASSERT_FALSE(std::find(messages.begin(), messages.end(), "cannot remove stale file '" + linkFileList + "': No such file or directory") != messages.end());
}